

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.cpp
# Opt level: O2

size_t duckdb_zstd::ZSTD_compressBlock_greedy_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  BYTE *iEnd;
  int *ilimit_w;
  undefined8 *puVar1;
  uint uVar2;
  BYTE *pBVar3;
  ZSTD_matchState_t *pZVar4;
  undefined8 uVar5;
  U32 UVar6;
  uint uVar7;
  ulong uVar8;
  seqDef *psVar9;
  size_t sVar10;
  BYTE *pBVar11;
  ulong uVar12;
  long lVar13;
  int *ip;
  BYTE *litEnd_1;
  int *piVar14;
  BYTE *pBVar15;
  uint uVar16;
  BYTE *litEnd;
  U32 local_a4;
  U32 local_a0;
  BYTE *litLimit_w;
  size_t offbaseFound;
  BYTE *local_70;
  BYTE *local_68;
  BYTE *local_60;
  int *local_58;
  BYTE *local_50;
  U32 *local_48;
  ulong local_40;
  BYTE *local_38;
  
  pBVar3 = (ms->window).base;
  uVar2 = (ms->window).dictLimit;
  local_70 = pBVar3 + uVar2;
  uVar16 = (ms->cParams).minMatch;
  uVar7 = 6;
  if (uVar16 < 6) {
    uVar7 = uVar16;
  }
  uVar16 = 4;
  if (4 < uVar7) {
    uVar16 = uVar7;
  }
  pZVar4 = ms->dictMatchState;
  local_68 = (pZVar4->window).nextSrc;
  local_38 = (pZVar4->window).base;
  local_50 = local_38 + (pZVar4->window).dictLimit;
  local_40 = (ulong)(((int)local_38 - (int)local_68) + uVar2);
  local_a0 = *rep;
  ip = (int *)((ulong)(((int)src - ((int)local_50 + (int)local_70)) + (int)local_68 == 0) +
              (long)src);
  local_a4 = rep[1];
  ms->lazySkipping = 0;
  local_60 = local_38 + -local_40;
  iEnd = (BYTE *)((long)src + srcSize);
  local_58 = (int *)((long)src + (srcSize - 8));
  ilimit_w = (int *)((long)src + (srcSize - 0x20));
  local_48 = rep;
LAB_0039073c:
  do {
    if (local_58 <= ip) {
      *local_48 = local_a0;
      local_48[1] = local_a4;
      return (long)iEnd - (long)src;
    }
    uVar7 = (((int)ip - (int)pBVar3) - local_a0) + 1;
    if (uVar7 - uVar2 < 0xfffffffd) {
      piVar14 = (int *)(pBVar3 + uVar7);
      if (uVar7 < uVar2) {
        piVar14 = (int *)(local_38 + (uVar7 - (int)local_40));
      }
      if (*piVar14 != *(int *)((long)ip + 1)) goto LAB_00390782;
      pBVar11 = iEnd;
      if (uVar7 < uVar2) {
        pBVar11 = local_68;
      }
      sVar10 = ZSTD_count_2segments
                         ((BYTE *)((long)ip + 5),(BYTE *)(piVar14 + 1),iEnd,pBVar11,local_70);
      uVar8 = sVar10 + 4;
      ip = (int *)((long)ip + 1);
      sVar10 = 1;
    }
    else {
LAB_00390782:
      offbaseFound = 999999999;
      if (uVar16 == 6) {
        uVar8 = ZSTD_HcFindBestMatch_dictMatchState_6(ms,(BYTE *)ip,iEnd,&offbaseFound);
      }
      else if (uVar16 == 5) {
        uVar8 = ZSTD_HcFindBestMatch_dictMatchState_5(ms,(BYTE *)ip,iEnd,&offbaseFound);
      }
      else {
        uVar8 = ZSTD_HcFindBestMatch_dictMatchState_4(ms,(BYTE *)ip,iEnd,&offbaseFound);
      }
      if (uVar8 < 4) {
        uVar8 = (long)ip - (long)src;
        ip = (int *)((long)ip + (uVar8 >> 8) + 1);
        ms->lazySkipping = (uint)(0x7ff < uVar8);
        goto LAB_0039073c;
      }
      sVar10 = offbaseFound;
      if (3 < offbaseFound) {
        uVar12 = (long)ip + (-(long)pBVar3 - offbaseFound) + -0xfffffffd;
        pBVar15 = pBVar3;
        pBVar11 = local_70;
        if ((uint)uVar12 < uVar2) {
          pBVar15 = local_60;
          pBVar11 = local_50;
        }
        pBVar15 = pBVar15 + (uVar12 & 0xffffffff);
        for (; ((src < ip && (pBVar11 < pBVar15)) && (*(BYTE *)((long)ip + -1) == pBVar15[-1]));
            ip = (int *)((long)ip + -1)) {
          pBVar15 = pBVar15 + -1;
          uVar8 = uVar8 + 1;
        }
        local_a4 = local_a0;
        local_a0 = (int)offbaseFound - 3;
      }
    }
    uVar12 = (long)ip - (long)src;
    pBVar11 = seqStore->lit;
    if (ilimit_w < ip) {
      ZSTD_safecopyLiterals(pBVar11,(BYTE *)src,(BYTE *)ip,(BYTE *)ilimit_w);
LAB_003908df:
      seqStore->lit = seqStore->lit + uVar12;
      psVar9 = seqStore->sequences;
      if (0xffff < uVar12) {
        seqStore->longLengthType = ZSTD_llt_literalLength;
        seqStore->longLengthPos = (U32)((ulong)((long)psVar9 - (long)seqStore->sequencesStart) >> 3)
        ;
      }
    }
    else {
      uVar5 = *(undefined8 *)((long)src + 8);
      *(undefined8 *)pBVar11 = *src;
      *(undefined8 *)(pBVar11 + 8) = uVar5;
      pBVar11 = seqStore->lit;
      if (0x10 < uVar12) {
        uVar5 = *(undefined8 *)((long)src + 0x18);
        *(undefined8 *)(pBVar11 + 0x10) = *(undefined8 *)((long)src + 0x10);
        *(undefined8 *)(pBVar11 + 0x18) = uVar5;
        if (0x20 < (long)uVar12) {
          lVar13 = 0;
          do {
            puVar1 = (undefined8 *)((long)src + lVar13 + 0x20);
            uVar5 = puVar1[1];
            pBVar15 = pBVar11 + lVar13 + 0x20;
            *(undefined8 *)pBVar15 = *puVar1;
            *(undefined8 *)(pBVar15 + 8) = uVar5;
            puVar1 = (undefined8 *)((long)src + lVar13 + 0x30);
            uVar5 = puVar1[1];
            *(undefined8 *)(pBVar15 + 0x10) = *puVar1;
            *(undefined8 *)(pBVar15 + 0x18) = uVar5;
            lVar13 = lVar13 + 0x20;
          } while (pBVar15 + 0x20 < pBVar11 + uVar12);
        }
        goto LAB_003908df;
      }
      seqStore->lit = pBVar11 + uVar12;
      psVar9 = seqStore->sequences;
    }
    psVar9->litLength = (U16)uVar12;
    psVar9->offBase = (U32)sVar10;
    if (0xffff < uVar8 - 3) {
      seqStore->longLengthType = ZSTD_llt_matchLength;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar9 - (long)seqStore->sequencesStart) >> 3);
    }
    psVar9->mlBase = (U16)(uVar8 - 3);
    seqStore->sequences = psVar9 + 1;
    if (ms->lazySkipping != 0) {
      ms->lazySkipping = 0;
    }
    UVar6 = local_a4;
    for (ip = (int *)((long)ip + uVar8); local_a4 = UVar6, src = ip, ip <= local_58;
        ip = (int *)((long)ip + sVar10 + 4)) {
      uVar7 = ((int)ip - (int)pBVar3) - local_a4;
      pBVar11 = pBVar3;
      if (uVar7 < uVar2) {
        pBVar11 = local_60;
      }
      if ((0xfffffffc < uVar7 - uVar2) || (*(int *)(pBVar11 + uVar7) != *ip)) break;
      pBVar15 = iEnd;
      if (uVar7 < uVar2) {
        pBVar15 = local_68;
      }
      sVar10 = ZSTD_count_2segments
                         ((BYTE *)(ip + 1),(BYTE *)((long)(pBVar11 + uVar7) + 4),iEnd,pBVar15,
                          local_70);
      pBVar11 = seqStore->lit;
      if (ilimit_w < ip) {
        ZSTD_safecopyLiterals(pBVar11,(BYTE *)ip,(BYTE *)ip,(BYTE *)ilimit_w);
      }
      else {
        uVar5 = *(undefined8 *)(ip + 2);
        *(undefined8 *)pBVar11 = *(undefined8 *)ip;
        *(undefined8 *)(pBVar11 + 8) = uVar5;
      }
      psVar9 = seqStore->sequences;
      psVar9->litLength = 0;
      psVar9->offBase = 1;
      if (0xffff < sVar10 + 1) {
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos = (U32)((ulong)((long)psVar9 - (long)seqStore->sequencesStart) >> 3)
        ;
      }
      psVar9->mlBase = (U16)(sVar10 + 1);
      seqStore->sequences = psVar9 + 1;
      UVar6 = local_a0;
      local_a0 = local_a4;
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_greedy_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 0, ZSTD_dictMatchState);
}